

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O2

void __thiscall
ELFIO::section_impl<ELFIO::Elf32_Shdr>::insert_data
          (section_impl<ELFIO::Elf32_Shdr> *this,Elf_Xword pos,char *raw_data,Elf_Xword size)

{
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  _Head_base<0UL,_char_*,_false> __p;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer __dest;
  undefined4 extraout_var_01;
  size_t sVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar7;
  unique_ptr<char[],_std::default_delete<char[]>_> new_data;
  _Head_base<0UL,_char_*,_false> local_40;
  ulong local_38;
  
  iVar4 = (*(this->super_section)._vptr_section[5])();
  if ((iVar4 != 8) &&
     (iVar4 = (*(this->super_section)._vptr_section[0x13])(this),
     pos <= CONCAT44(extraout_var,iVar4))) {
    iVar4 = (*(this->super_section)._vptr_section[0x13])(this);
    local_38 = CONCAT44(extraout_var_00,iVar4) + size;
    if (!CARRY8(CONCAT44(extraout_var_00,iVar4),size)) {
      uVar1 = this->data_size;
      if (uVar1 < local_38) {
        if ((long)uVar1 < 0) {
          return;
        }
        uVar7 = uVar1 * 2 + size;
        if (CARRY8(uVar1 * 2,size)) {
          return;
        }
        __dest = (pointer)operator_new__(uVar7,(nothrow_t *)&std::nothrow);
        local_40._M_head_impl = __dest;
        if (__dest == (pointer)0x0) {
          std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                    ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_40);
          return;
        }
        pcVar2 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
        if (pos != 0) {
          memmove(__dest,pcVar2,pos);
        }
        if (size != 0) {
          memcpy(__dest + pos,raw_data,size);
        }
        iVar4 = (*(this->super_section)._vptr_section[0x13])(this);
        __p._M_head_impl = local_40._M_head_impl;
        sVar6 = CONCAT44(extraout_var_01,iVar4) - pos;
        if (sVar6 != 0) {
          memmove(local_40._M_head_impl + size + pos,pcVar2 + pos,sVar6);
        }
        local_40._M_head_impl = (char *)0x0;
        std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
                  ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&this->data,
                   __p._M_head_impl);
        this->data_size = uVar7;
        std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                  ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_40);
      }
      else {
        pcVar3 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
        pcVar2 = pcVar3 + pos;
        iVar4 = (*(this->super_section)._vptr_section[0x13])(this);
        iVar5 = (*(this->super_section)._vptr_section[0x13])(this);
        sVar6 = CONCAT44(extraout_var_02,iVar4) - pos;
        if (sVar6 != 0) {
          memmove(pcVar3 + ((size + CONCAT44(extraout_var_03,iVar5)) - sVar6),pcVar2,sVar6);
        }
        if (size != 0) {
          memmove(pcVar2,raw_data,size);
        }
      }
      (*(this->super_section)._vptr_section[0x14])(this,&local_38);
      if ((this->translator->addr_translations).
          super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->translator->addr_translations).
          super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        iVar4 = (*(this->super_section)._vptr_section[0x20])(this);
        (*(this->super_section)._vptr_section[0x21])(this,size + CONCAT44(extraout_var_04,iVar4));
      }
    }
  }
  return;
}

Assistant:

void
    insert_data( Elf_Xword pos, const char* raw_data, Elf_Xword size ) override
    {
        if ( get_type() != SHT_NOBITS ) {
            // Check for valid position
            if ( pos > get_size() ) {
                return; // Invalid position
            }

            // Check for integer overflow in size calculation
            Elf_Xword new_size = get_size();
            if ( size > std::numeric_limits<Elf_Xword>::max() - new_size ) {
                return; // Size would overflow
            }
            new_size += size;

            if ( new_size <= data_size ) {
                char* d = data.get();
                std::copy_backward( d + pos, d + get_size(),
                                    d + get_size() + size );
                std::copy( raw_data, raw_data + size, d + pos );
            }
            else {
                // Calculate new size with overflow check
                Elf_Xword new_data_size = data_size;
                if ( new_data_size > std::numeric_limits<Elf_Xword>::max() / 2 ) {
                    return; // Multiplication would overflow
                }
                new_data_size *= 2;
                if ( size > std::numeric_limits<Elf_Xword>::max() - new_data_size ) {
                    return; // Addition would overflow
                }
                new_data_size += size;

                // Check if the size would overflow size_t
                if (new_data_size > std::numeric_limits<size_t>::max()) {
                    return; // Size would overflow size_t
                }

                std::unique_ptr<char[]> new_data(
                    new (std::nothrow) char[(size_t)new_data_size]);

                if ( nullptr != new_data ) {
                    char* d = data.get();
                    std::copy( d, d + pos, new_data.get() );
                    std::copy( raw_data, raw_data + size,
                               new_data.get() + pos );
                    std::copy( d + pos, d + get_size(),
                               new_data.get() + pos + size );
                    data = std::move( new_data );
                    data_size = new_data_size;
                }
                else {
                    return; // Allocation failed
                }
            }
            set_size( new_size );
            if ( translator->empty() ) {
                set_stream_size( get_stream_size() + (size_t)size );
            }
        }
    }